

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.h
# Opt level: O0

bool __thiscall
ThreadContext::IsOldEntryPointInfo(ThreadContext *this,ProxyEntryPointInfo *entryPointInfo)

{
  RecyclableData *pRVar1;
  FunctionEntryPointInfo **ppFVar2;
  FunctionEntryPointInfo *local_28;
  FunctionEntryPointInfo *current;
  ProxyEntryPointInfo *entryPointInfo_local;
  ThreadContext *this_local;
  
  pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  ppFVar2 = Memory::WriteBarrierPtr::operator_cast_to_FunctionEntryPointInfo__
                      ((WriteBarrierPtr *)&pRVar1->oldEntryPointInfo);
  local_28 = *ppFVar2;
  while( true ) {
    if (local_28 == (FunctionEntryPointInfo *)0x0) {
      return false;
    }
    if (local_28 == (FunctionEntryPointInfo *)entryPointInfo) break;
    ppFVar2 = Memory::WriteBarrierPtr::operator_cast_to_FunctionEntryPointInfo__
                        ((WriteBarrierPtr *)&local_28->nextEntryPoint);
    local_28 = *ppFVar2;
  }
  return true;
}

Assistant:

bool IsOldEntryPointInfo(Js::ProxyEntryPointInfo* entryPointInfo)
    {
        Js::FunctionEntryPointInfo* current = this->recyclableData->oldEntryPointInfo;
        while (current != nullptr)
        {
            if (current == entryPointInfo)
                return true;
            current = current->nextEntryPoint;
        }
        return false;
    }